

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::ConflictPoolPropagation::propagateConflict
          (ConflictPoolPropagation *this,HighsInt conflict)

{
  byte *pbVar1;
  double dVar2;
  uint uVar3;
  pointer puVar4;
  HighsDomain *pHVar5;
  HighsConflictPool *pHVar6;
  pointer ppVar7;
  _Map_pointer ppCVar8;
  pointer psVar9;
  int *piVar10;
  uint linkPos;
  HighsInt HVar11;
  HighsBoundType HVar12;
  pointer pHVar13;
  size_type sVar14;
  Reason RVar15;
  uint uVar16;
  ulong uVar17;
  Reason reason;
  long lVar18;
  byte bVar19;
  HighsBoundType *pHVar20;
  ulong uVar21;
  pointer pWVar22;
  bool bVar23;
  HighsDomainChange HVar24;
  array<int,_2UL> inactive;
  int local_40 [2];
  double local_38;
  
  pbVar1 = (this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start + conflict;
  *pbVar1 = *pbVar1 & 0xb;
  puVar4 = (this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (1 < puVar4[conflict]) {
    return;
  }
  pHVar5 = this->domain;
  if (pHVar5->infeasible_ != false) {
    return;
  }
  pHVar6 = this->conflictpool_;
  ppVar7 = (pHVar6->conflictRanges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar16 = ppVar7[conflict].first;
  uVar17 = (ulong)(int)uVar16;
  if (uVar17 == 0xffffffffffffffff) {
    unlinkWatchedLiteral(this,conflict * 2);
    unlinkWatchedLiteral(this,conflict * 2 + 1);
    return;
  }
  uVar3 = ppVar7[conflict].second;
  linkPos = conflict * 2;
  if (uVar16 == uVar3) {
    bVar19 = 0;
  }
  else {
    pHVar20 = &(pHVar6->conflictEntries_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17].boundtype;
    bVar19 = 0;
    do {
      if (*pHVar20 == kLower) {
        bVar23 = (pHVar5->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)pHVar20[-1]] <
                 ((HighsDomainChange *)(pHVar20 + -3))->boundval;
      }
      else {
        bVar23 = ((HighsDomainChange *)(pHVar20 + -3))->boundval <
                 (pHVar5->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)pHVar20[-1]];
      }
      if (bVar23) {
        uVar21 = (ulong)bVar19;
        bVar19 = bVar19 + 1;
        local_40[uVar21] = (int)uVar17;
        if (bVar19 == 2) break;
      }
      uVar16 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar16;
      pHVar20 = pHVar20 + 4;
    } while (uVar3 != uVar16);
  }
  pWVar22 = (this->watchedLiterals_).
            super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
            ._M_impl.super__Vector_impl_data._M_start + (int)linkPos;
  puVar4[conflict] = bVar19;
  if (bVar19 != 2) {
    if (bVar19 == 1) {
      pHVar5 = this->domain;
      HVar24 = flip(pHVar5,(pHVar6->conflictEntries_).
                           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                           ._M_impl.super__Vector_impl_data._M_start + local_40[0]);
      uVar17 = HVar24._8_8_;
      local_38 = HVar24.boundval;
      if (uVar17 >> 0x20 == 0) {
        bVar23 = (pHVar5->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[HVar24.column] < local_38;
      }
      else {
        bVar23 = local_38 <
                 (pHVar5->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[HVar24.column];
      }
      if (!bVar23) {
        return;
      }
      sVar14 = std::
               deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
               ::size(&pHVar5->cutpoolpropagation);
      reason.index = conflict;
      reason.type = (int)sVar14 + this->conflictpoolindex;
      HVar24.column = (int)uVar17;
      HVar24.boundtype = (int)(uVar17 >> 0x20);
      HVar24.boundval = local_38;
      changeBound(pHVar5,HVar24,reason);
    }
    else {
      if (bVar19 != 0) {
        return;
      }
      pHVar5 = this->domain;
      pHVar5->infeasible_ = true;
      ppCVar8 = (pHVar5->cutpoolpropagation).
                super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      RVar15.type = (int)((ulong)((long)(pHVar5->cutpoolpropagation).
                                        super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_last -
                                 (long)(pHVar5->cutpoolpropagation).
                                       super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) *
                    0x38e38e39 +
                    (int)((ulong)((long)(pHVar5->cutpoolpropagation).
                                        super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                 (long)(pHVar5->cutpoolpropagation).
                                       super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 4) *
                    0x38e38e39 +
                    ((int)((ulong)((long)ppCVar8 -
                                  (long)(pHVar5->cutpoolpropagation).
                                        super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1
                    + (uint)(ppCVar8 == (_Map_pointer)0x0)) * 3 + this->conflictpoolindex;
      RVar15.index = conflict;
      pHVar5->infeasible_reason = RVar15;
      pHVar5 = this->domain;
      pHVar5->infeasible_pos =
           (HighsInt)
           ((ulong)((long)(pHVar5->domchgstack_).
                          super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pHVar5->domchgstack_).
                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    psVar9 = (this->conflictpool_->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar18 = (long)psVar9[conflict];
    if (lVar18 < 1) {
      return;
    }
    piVar10 = (this->conflictpool_->ageDistribution_).super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    piVar10[lVar18] = piVar10[lVar18] + -1;
    *piVar10 = *piVar10 + 1;
    psVar9[conflict] = 0;
    return;
  }
  lVar18 = (long)local_40[0];
  pHVar13 = (pHVar6->conflictEntries_).
            super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((pWVar22->domchg).boundtype == pHVar13[lVar18].boundtype) &&
     (pHVar13 = pHVar13 + lVar18, (pWVar22->domchg).column == pHVar13->column)) {
    dVar2 = (pWVar22->domchg).boundval;
    if ((dVar2 == pHVar13->boundval) && (!NAN(dVar2) && !NAN(pHVar13->boundval))) goto LAB_00295a00;
  }
  unlinkWatchedLiteral(this,linkPos);
  pHVar13 = (pHVar6->conflictEntries_).
            super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
            super__Vector_impl_data._M_start + lVar18;
  HVar11 = pHVar13->column;
  HVar12 = pHVar13->boundtype;
  (pWVar22->domchg).boundval = pHVar13->boundval;
  (pWVar22->domchg).column = HVar11;
  (pWVar22->domchg).boundtype = HVar12;
  linkWatchedLiteral(this,linkPos);
LAB_00295a00:
  lVar18 = (long)local_40[1];
  pHVar13 = (pHVar6->conflictEntries_).
            super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((pWVar22[1].domchg.boundtype == pHVar13[lVar18].boundtype) &&
     (pHVar13 = pHVar13 + lVar18, pWVar22[1].domchg.column == pHVar13->column)) {
    dVar2 = pWVar22[1].domchg.boundval;
    if ((dVar2 == pHVar13->boundval) && (!NAN(dVar2) && !NAN(pHVar13->boundval))) {
      return;
    }
  }
  unlinkWatchedLiteral(this,linkPos | 1);
  pHVar13 = (pHVar6->conflictEntries_).
            super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
            super__Vector_impl_data._M_start + lVar18;
  HVar11 = pHVar13->column;
  HVar12 = pHVar13->boundtype;
  pWVar22[1].domchg.boundval = pHVar13->boundval;
  pWVar22[1].domchg.column = HVar11;
  pWVar22[1].domchg.boundtype = HVar12;
  linkWatchedLiteral(this,linkPos | 1);
  return;
}

Assistant:

void HighsDomain::ConflictPoolPropagation::propagateConflict(
    HighsInt conflict) {
  // remove propagate flag, but keep watched and deleted information
  conflictFlag_[conflict] &= (3 | 8);
  // if two inactive literals are watched or conflict has been deleted skip
  if (conflictFlag_[conflict] >= 2) return;

  if (domain->infeasible_) return;

  const std::vector<HighsDomainChange>& entries =
      conflictpool_->getConflictEntryVector();
  HighsInt start = conflictpool_->getConflictRanges()[conflict].first;
  if (start == -1) {
    unlinkWatchedLiteral(2 * conflict);
    unlinkWatchedLiteral(2 * conflict + 1);
    return;
  }
  HighsInt end = conflictpool_->getConflictRanges()[conflict].second;

  WatchedLiteral* watched = watchedLiterals_.data() + 2 * conflict;

  std::array<HighsInt, 2> inactive;
  uint8_t numInactive = 0;
  for (HighsInt i = start; i != end; ++i) {
    if (domain->isActive(entries[i])) continue;

    inactive[numInactive++] = i;
    if (numInactive == 2) break;
  }

  conflictFlag_[conflict] = numInactive;

  switch (numInactive) {
    case 0:
      assert(!domain->infeasible_);
      domain->mipsolver->mipdata_->debugSolution.nodePruned(*domain);
      domain->infeasible_ = true;
      domain->infeasible_reason = Reason::cut(
          domain->cutpoolpropagation.size() + conflictpoolindex, conflict);
      domain->infeasible_pos = domain->domchgstack_.size();
      conflictpool_->resetAge(conflict);
      // printf("conflict propagation found infeasibility\n");
      break;
    case 1: {
      HighsDomainChange domchg = domain->flip(entries[inactive[0]]);
      if (!domain->isActive(domchg)) {
        domain->changeBound(
            domain->flip(entries[inactive[0]]),
            Reason::cut(domain->cutpoolpropagation.size() + conflictpoolindex,
                        conflict));
        conflictpool_->resetAge(conflict);
      }
      // printf("conflict propagation found bound change\n");
      break;
    }
    case 2: {
      if (watched[0].domchg != entries[inactive[0]]) {
        unlinkWatchedLiteral(2 * conflict);
        watched[0].domchg = entries[inactive[0]];
        linkWatchedLiteral(2 * conflict);
      }

      if (watched[1].domchg != entries[inactive[1]]) {
        unlinkWatchedLiteral(2 * conflict + 1);
        watched[1].domchg = entries[inactive[1]];
        linkWatchedLiteral(2 * conflict + 1);
      }

      return;
    }
  }
}